

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

uint8_t url_hex_val(char c)

{
  undefined1 local_9;
  char c_local;
  
  if ((c < '0') || ('9' < c)) {
    if ((c < 'A') || ('F' < c)) {
      if ((c < 'a') || ('f' < c)) {
        local_9 = '\0';
      }
      else {
        local_9 = c + 0xa9;
      }
    }
    else {
      local_9 = c + 0xc9;
    }
  }
  else {
    local_9 = c + 0xd0;
  }
  return local_9;
}

Assistant:

static uint8_t
url_hex_val(char c)
{
	if ((c >= '0') && (c <= '9')) {
		return (c - '0');
	}
	if ((c >= 'A') && (c <= 'F')) {
		return ((c - 'A') + 10);
	}
	if ((c >= 'a') && (c <= 'f')) {
		return ((c - 'a') + 10);
	}
	return (0);
}